

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzz_issue_tests.cpp
# Opt level: O2

void __thiscall
roundTripString_rtripconversions_Test::~roundTripString_rtripconversions_Test
          (roundTripString_rtripconversions_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x18);
  return;
}

Assistant:

TEST_P(roundTripString, rtripconversions)
{
    auto u1 = unit_from_string(GetParam());
    EXPECT_FALSE(is_error(u1));
    auto str = to_string(u1);
    auto u2 = unit_from_string(str);
    EXPECT_FALSE(is_error(u2));
    EXPECT_EQ(unit_cast(u2), unit_cast(u1));
}